

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRExtension * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::allocate<spirv_cross::SPIRExtension&>
          (ObjectPool<spirv_cross::SPIRExtension> *this,SPIRExtension *p)

{
  Vector<spirv_cross::SPIRExtension_*> *this_00;
  undefined4 uVar1;
  SPIRExtension *pSVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  SPIRExtension *ptr;
  SPIRExtension *local_40;
  SPIRExtension *local_38;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>.buffer_size;
  if (sVar3 == 0) {
    uVar4 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRExtension,_spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar2 = (SPIRExtension *)malloc(uVar4 << 4);
    if (pSVar2 == (SPIRExtension *)0x0) {
      return (SPIRExtension *)0x0;
    }
    local_38 = pSVar2;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      local_40 = pSVar2;
      SmallVector<spirv_cross::SPIRExtension_*,_0UL>::push_back(this_00,&local_40);
      pSVar2 = pSVar2 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRExtension*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRExtension,spirv_cross::ObjectPool<spirv_cross::SPIRExtension>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar3 = (this->vacants).super_VectorView<spirv_cross::SPIRExtension_*>.buffer_size;
  }
  pSVar2 = (this_00->super_VectorView<spirv_cross::SPIRExtension_*>).ptr[sVar3 - 1];
  SmallVector<spirv_cross::SPIRExtension_*,_0UL>::pop_back(this_00);
  (pSVar2->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_00465908;
  uVar1 = *(undefined4 *)&(p->super_IVariant).field_0xc;
  (pSVar2->super_IVariant).self = (ID)(p->super_IVariant).self.id;
  *(undefined4 *)&(pSVar2->super_IVariant).field_0xc = uVar1;
  return pSVar2;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}